

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascDecrypt.cpp
# Opt level: O3

int CascDecrypt(TCascStorage *hs,LPBYTE pbOutBuffer,PDWORD pcbOutBuffer,LPBYTE pbInBuffer,
               DWORD cbInBuffer,DWORD dwFrameIndex)

{
  byte bVar1;
  BYTE BVar2;
  uint cbKeySize;
  byte bVar3;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  void *pvVar9;
  LPBYTE pBVar10;
  ulong __n;
  ulong __n_00;
  uint uVar11;
  LPBYTE pBVar12;
  size_t cbInBuffer_00;
  BYTE Vector [8];
  ULONGLONG KeyName;
  undefined8 local_60;
  DWORD local_54;
  uint *local_50;
  undefined8 local_48;
  LPBYTE local_40;
  undefined8 local_38;
  byte bVar4;
  byte bVar5;
  
  local_48 = 0;
  if (cbInBuffer == 0) {
    return 0x3ec;
  }
  __n = (ulong)*pbInBuffer;
  if ((*pbInBuffer & 0xf7) == 0) {
    pBVar12 = pbInBuffer + cbInBuffer;
    pBVar10 = pbInBuffer + __n + 1;
    if (pBVar12 <= pBVar10) {
      return 0x3ec;
    }
    local_54 = dwFrameIndex;
    local_50 = pcbOutBuffer;
    local_40 = pbOutBuffer;
    memcpy(&local_48,pbInBuffer + 1,__n);
    bVar1 = (pbInBuffer + 1)[__n];
    __n_00 = (ulong)bVar1;
    if ((bVar1 == 8) || (bVar1 == 4)) {
      if (pBVar12 <= pBVar10 + __n_00 + 1) {
        return 0x3ec;
      }
      local_60 = 0;
      memcpy(&local_60,pbInBuffer + __n + 2,__n_00);
      BVar2 = (pbInBuffer + __n + 2)[__n_00];
      if ((BVar2 != 'S') && (BVar2 != 'A')) {
        return 0x5f;
      }
      cbInBuffer_00 = (long)pBVar12 - (long)(pBVar10 + __n_00 + 2);
      uVar11 = (uint)cbInBuffer_00;
      if (*local_50 < uVar11) {
        return 0x69;
      }
      local_38 = local_48;
      pvVar9 = Map_FindObject(hs->pEncryptionKeys,&local_38,(PDWORD)0x0);
      if (pvVar9 != (void *)0x0) {
        uVar6 = (ushort)local_54 & 0xff;
        uVar7 = (ushort)(local_54 >> 8) & 0xff;
        uVar8 = (ushort)(local_54 >> 0x10) & 0xff;
        bVar1 = ((local_54 & 0xff) != 0) * (uVar6 < 0x100) * (char)local_54 - (0xff < uVar6);
        bVar3 = ((local_54 & 0xff00) != 0) * (uVar7 < 0x100) * (char)(local_54 >> 8) -
                (0xff < uVar7);
        bVar4 = ((local_54 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(local_54 >> 0x10) -
                (0xff < uVar8);
        bVar5 = (byte)(local_54 >> 0x18);
        uVar6 = (ushort)bVar5;
        bVar5 = (uVar6 != 0) * (uVar6 < 0x100) * bVar5 - (0xff < uVar6);
        cbKeySize = CONCAT13((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5),
                             CONCAT12((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),
                                      CONCAT11((bVar3 != 0) * (bVar3 < 0x100) * bVar3 -
                                               (0xff < bVar3),
                                               (bVar1 != 0) * (bVar1 < 0x100) * bVar1 -
                                               (0xff < bVar1)))) ^ (uint)local_60;
        local_60 = CONCAT44(local_60._4_4_,cbKeySize);
        if (BVar2 == 'S') {
          Decrypt_Salsa20(local_40,pBVar10 + __n_00 + 2,cbInBuffer_00,(LPBYTE)((long)pvVar9 + 8),
                          cbKeySize,(LPBYTE)(ulong)local_60._4_4_);
          *local_50 = uVar11;
          return 0;
        }
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/CascDecrypt.cpp"
                      ,0x1a9,"int CascDecrypt(TCascStorage *, LPBYTE, PDWORD, LPBYTE, DWORD, DWORD)"
                     );
      }
      return 0x3ed;
    }
  }
  return 0x5f;
}

Assistant:

int CascDecrypt(TCascStorage * hs, LPBYTE pbOutBuffer, PDWORD pcbOutBuffer, LPBYTE pbInBuffer, DWORD cbInBuffer, DWORD dwFrameIndex)
{
    ULONGLONG KeyName = 0;
    LPBYTE pbBufferEnd = pbInBuffer + cbInBuffer;
    LPBYTE pbKey;
    DWORD KeyNameSize;
    DWORD dwShift = 0;
    DWORD IVSize;
    BYTE Vector[0x08];
    BYTE EncryptionType;
    int nError;

    // Verify and retrieve the key name size
    if(pbInBuffer >= pbBufferEnd)
        return ERROR_FILE_CORRUPT;
    if(pbInBuffer[0] != 0 && pbInBuffer[0] != 8)
        return ERROR_NOT_SUPPORTED;
    KeyNameSize = *pbInBuffer++;

    // Copy the key name
    if((pbInBuffer + KeyNameSize) >= pbBufferEnd)
        return ERROR_FILE_CORRUPT;
    memcpy(&KeyName, pbInBuffer, KeyNameSize);
    pbInBuffer += KeyNameSize;

    // Verify and retrieve the Vector size
    if(pbInBuffer >= pbBufferEnd)
        return ERROR_FILE_CORRUPT;
    if(pbInBuffer[0] != 4 && pbInBuffer[0] != 8)
        return ERROR_NOT_SUPPORTED;
    IVSize = *pbInBuffer++;

    // Copy the initialization vector
    if((pbInBuffer + IVSize) >= pbBufferEnd)
        return ERROR_FILE_CORRUPT;
    memset(Vector, 0, sizeof(Vector));
    memcpy(Vector, pbInBuffer, IVSize);
    pbInBuffer += IVSize;

    // Verify and retrieve the encryption type
    if(pbInBuffer >= pbBufferEnd)
        return ERROR_FILE_CORRUPT;
    if(pbInBuffer[0] != 'S' && pbInBuffer[0] != 'A')
        return ERROR_NOT_SUPPORTED;
    EncryptionType = *pbInBuffer++;

    // Do we have enough space in the output buffer?
    if((DWORD)(pbBufferEnd - pbInBuffer) > pcbOutBuffer[0])
        return ERROR_INSUFFICIENT_BUFFER;

    // Check if we know the key
    pbKey = CascFindKey(hs, KeyName);
    if(pbKey == NULL)
        return ERROR_FILE_ENCRYPTED;

    // Shuffle the Vector with the block index
    // Note that there's no point to go beyond 32 bits, unless the file has
    // more than 0xFFFFFFFF frames.
    for(size_t i = 0; i < sizeof(dwFrameIndex); i++)
    {
        Vector[i] = Vector[i] ^ (BYTE)((dwFrameIndex >> dwShift) & 0xFF);
        dwShift += 8;
    }

    // Perform the decryption-specific action
    switch(EncryptionType)
    {
        case 'S':   // Salsa20
            nError = Decrypt_Salsa20(pbOutBuffer, pbInBuffer, (pbBufferEnd - pbInBuffer), pbKey, 0x10, Vector);
            if(nError != ERROR_SUCCESS)
                return nError;

            // Supply the size of the output buffer
            pcbOutBuffer[0] = (DWORD)(pbBufferEnd - pbInBuffer);
            return ERROR_SUCCESS;

//      case 'A':   
//          return ERROR_NOT_SUPPORTED;
    }

    assert(false);
    return ERROR_NOT_SUPPORTED;
}